

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O1

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  undefined1 *puVar1;
  connectdata *conn;
  bool bVar2;
  char cVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t sVar6;
  curl_slist *pcVar7;
  char *pcVar8;
  curl_slist *pcVar9;
  curl_slist *list;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  uchar *puVar13;
  uchar *data_00;
  uchar *data_01;
  uchar *key;
  size_t sVar14;
  int iVar15;
  char *tmp;
  char *pcVar16;
  ulong uVar17;
  byte *pbVar18;
  char *pcVar19;
  bool bVar20;
  char timestamp [17];
  Curl_HttpReq httpreq;
  uchar sign0 [32];
  uchar sign1 [32];
  char service [65];
  char region [65];
  char provider0 [65];
  dynbuf signed_headers;
  char provider1 [65];
  char *method;
  dynbuf canonical_headers;
  time_t clock;
  char date [9];
  uchar sha_hash [32];
  tm tm;
  char sha_hex [65];
  CURLcode local_450;
  char *local_428;
  undefined8 local_418 [2];
  undefined1 local_408;
  Curl_HttpReq local_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8;
  dynbuf local_2c8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268;
  char *local_258;
  dynbuf local_250;
  time_t local_230;
  undefined8 local_228;
  undefined1 local_220;
  byte local_1d8 [104];
  tm local_170;
  char local_138 [264];
  
  conn = data->conn;
  local_2d8 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_318 = 0;
  uStack_310 = 0;
  local_268 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_328 = 0;
  local_338 = 0;
  uStack_330 = 0;
  local_348 = 0;
  uStack_340 = 0;
  local_358 = 0;
  uStack_350 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_378 = 0;
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3b8 = 0;
  uStack_3b0 = 0;
  pcVar8 = (conn->host).name;
  puVar13 = (uchar *)(data->set).postfields;
  pcVar16 = (data->state).aptr.user;
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "";
  }
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_3d8 = 0;
  uStack_3d0 = 0;
  pcVar5 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar5 != (char *)0x0) {
    return CURLE_OK;
  }
  Curl_dyn_init(&local_250,0x19000);
  Curl_dyn_init(&local_2c8,0x19000);
  pcVar5 = (data->set).str[0x4e];
  pcVar19 = "aws:amz";
  if (pcVar5 != (char *)0x0) {
    pcVar19 = pcVar5;
  }
  __isoc99_sscanf(pcVar19,"%64[^:]:%64[^:]:%64[^:]:%64s",&local_318,&local_2a8,&local_368,&local_3b8
                 );
  if ((char)local_318 == '\0') {
    local_428 = (char *)0x0;
    Curl_failf(data,"first provider can\'t be empty");
    local_450 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    if ((char)local_2a8 == '\0') {
      strcpy((char *)&local_2a8,(char *)&local_318);
    }
    if ((uchar)local_3b8 == '\0') {
      pcVar5 = strchr(pcVar8,0x2e);
      if (pcVar5 == (char *)0x0) {
        bVar20 = false;
        Curl_failf(data,"service missing in parameters and hostname");
        local_450 = CURLE_URL_MALFORMAT;
      }
      else {
        uVar17 = (long)pcVar5 - (long)pcVar8;
        if (uVar17 < 0x41) {
          strncpy((char *)&local_3b8,pcVar8,uVar17);
          *(undefined1 *)((long)&local_3b8 + uVar17) = 0;
          local_450 = CURLE_OUT_OF_MEMORY;
          bVar20 = true;
          if ((uchar)local_368 != '\0') goto LAB_005d468f;
          pcVar5 = pcVar5 + 1;
          pcVar19 = strchr(pcVar5,0x2e);
          if (pcVar19 == (char *)0x0) {
            pcVar5 = "region missing in parameters and hostname";
          }
          else {
            uVar17 = (long)pcVar19 - (long)pcVar5;
            if (uVar17 < 0x41) {
              strncpy((char *)&local_368,pcVar5,uVar17);
              *(undefined1 *)((long)&local_368 + uVar17) = 0;
              goto LAB_005d468f;
            }
            pcVar5 = "region too long in hostname";
          }
        }
        else {
          pcVar5 = "service too long in hostname";
        }
        bVar20 = false;
        Curl_failf(data,pcVar5);
        local_450 = CURLE_URL_MALFORMAT;
      }
LAB_005d468f:
      if (bVar20) goto LAB_005d4698;
    }
    else {
LAB_005d4698:
      time(&local_230);
      local_450 = Curl_gmtime(local_230,&local_170);
      if (local_450 == CURLE_OK) {
        sVar6 = strftime((char *)local_418,0x11,"%Y%m%dT%H%M%SZ",(tm *)&local_170);
        if (sVar6 != 0) {
          sVar6 = strlen((char *)&local_2a8);
          Curl_strntolower((char *)&local_2a8,(char *)&local_2a8,sVar6);
          cVar3 = Curl_raw_toupper((char)local_2a8);
          local_2a8 = CONCAT71(local_2a8._1_7_,cVar3);
          list = (curl_slist *)0x0;
          curl_msnprintf((char *)&local_228,0x48,"X-%s-Date",&local_2a8);
          Curl_strntolower((char *)&local_2a8,(char *)&local_2a8,1);
          curl_msnprintf((char *)local_1d8,0x5a,"x-%s-date:%s",&local_2a8,local_418);
          pcVar5 = Curl_checkheaders(data,"Host",4);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = (data->state).aptr.host;
            if (pcVar5 == (char *)0x0) {
              sVar6 = strlen(pcVar8);
              if (0xff < sVar6) goto LAB_005d4bb5;
              curl_msnprintf(local_138,0x105,"host:%s",pcVar8);
LAB_005d4c16:
              local_450 = CURLE_OUT_OF_MEMORY;
              list = curl_slist_append((curl_slist *)0x0,local_138);
              bVar20 = list == (curl_slist *)0x0;
            }
            else {
              sVar6 = strlen(pcVar5);
              if (sVar6 < 0x106) {
                strcpy(local_138,pcVar5);
                sVar6 = strcspn(local_138,"\n\r");
                local_138[sVar6] = '\0';
                goto LAB_005d4c16;
              }
LAB_005d4bb5:
              bVar20 = true;
              local_450 = CURLE_URL_MALFORMAT;
              list = (curl_slist *)0x0;
            }
            local_428 = (char *)0x0;
            pcVar8 = (char *)0x0;
            if (bVar20) goto LAB_005d4c44;
            if (!bVar20) goto LAB_005d478d;
          }
          else {
            local_450 = CURLE_OUT_OF_MEMORY;
LAB_005d478d:
            for (pcVar9 = (data->set).headers; pcVar7 = list, pcVar9 != (curl_slist *)0x0;
                pcVar9 = pcVar9->next) {
              pcVar7 = curl_slist_append(list,pcVar9->data);
              if (pcVar7 == (curl_slist *)0x0) {
                pcVar8 = (char *)0x0;
                goto LAB_005d4c44;
              }
              list = pcVar7;
            }
            for (; pcVar7 != (curl_slist *)0x0; pcVar7 = pcVar7->next) {
              pcVar8 = pcVar7->data;
              sVar6 = strcspn(pcVar8,":");
              Curl_strntolower(pcVar8,pcVar8,sVar6);
              if (pcVar7->data[sVar6] != '\0') {
                pcVar8 = pcVar7->data + sVar6 + 1;
                for (pcVar5 = pcVar8; (cVar3 = *pcVar5, cVar3 == '\t' || (cVar3 == ' '));
                    pcVar5 = pcVar5 + 1) {
                }
                while (cVar3 != '\0') {
                  iVar15 = 0;
                  for (; (cVar3 = *pcVar5, cVar3 == ' ' || (cVar3 == '\t')); pcVar5 = pcVar5 + 1) {
                    iVar15 = iVar15 + -1;
                  }
                  if (iVar15 == 0) {
                    pcVar5 = pcVar5 + 1;
LAB_005d492b:
                    *pcVar8 = cVar3;
                    pcVar8 = pcVar8 + 1;
                  }
                  else {
                    bVar20 = cVar3 != '\0';
                    cVar3 = ' ';
                    if (bVar20) goto LAB_005d492b;
                  }
                  cVar3 = *pcVar5;
                }
                *pcVar8 = '\0';
              }
            }
            sVar6 = strlen((char *)&local_228);
            pcVar8 = Curl_checkheaders(data,(char *)&local_228,sVar6);
            if (pcVar8 == (char *)0x0) {
              pcVar8 = Curl_checkheaders(data,"Date",4);
            }
            if (pcVar8 == (char *)0x0) {
              pcVar9 = curl_slist_append(list,(char *)local_1d8);
              pcVar8 = (char *)0x0;
              if (pcVar9 != (curl_slist *)0x0) {
                pcVar8 = curl_maprintf("%s: %s",&local_228,local_418);
                list = pcVar9;
                goto LAB_005d4a6f;
              }
            }
            else {
              pcVar8 = (*Curl_cstrdup)(pcVar8);
              if ((pcVar8 != (char *)0x0) && (pcVar5 = strchr(pcVar8,0x3a), pcVar5 != (char *)0x0))
              {
                do {
                  do {
                    pcVar5 = pcVar5 + 1;
                  } while (*pcVar5 == ' ');
                } while (*pcVar5 == '\t');
                strncpy((char *)local_418,pcVar5,0x10);
                local_408 = 0;
LAB_005d4a6f:
                if (list == (curl_slist *)0x0) {
                  local_450 = CURLE_OK;
                }
                else {
                  pcVar9 = list;
                  bVar20 = false;
                  do {
                    bVar2 = bVar20;
                    pcVar7 = pcVar9->next;
                    if (pcVar7 != (curl_slist *)0x0) {
                      pcVar5 = pcVar9->data;
                      pcVar19 = pcVar7->data;
                      iVar15 = strcmp(pcVar5,pcVar19);
                      if (0 < iVar15) {
                        pcVar9->data = pcVar19;
                        pcVar7->data = pcVar5;
                        bVar2 = true;
                      }
                    }
                    pcVar9 = pcVar7;
                    bVar20 = bVar2;
                  } while ((pcVar7 != (curl_slist *)0x0) || (pcVar9 = list, bVar20 = false, bVar2));
                  do {
                    CVar4 = Curl_dyn_add(&local_250,pcVar9->data);
                    if ((CVar4 != CURLE_OK) ||
                       (CVar4 = Curl_dyn_add(&local_250,"\n"), CVar4 != CURLE_OK))
                    goto LAB_005d4c44;
                    pcVar5 = strchr(pcVar9->data,0x3a);
                    if (pcVar5 != (char *)0x0) {
                      *pcVar5 = '\0';
                    }
                    if (((pcVar9 != list) &&
                        (CVar4 = Curl_dyn_add(&local_2c8,";"), CVar4 != CURLE_OK)) ||
                       (CVar4 = Curl_dyn_add(&local_2c8,pcVar9->data), CVar4 != CURLE_OK))
                    goto LAB_005d4c44;
                    pcVar9 = pcVar9->next;
                  } while (pcVar9 != (curl_slist *)0x0);
                  local_450 = CURLE_OK;
                }
              }
            }
LAB_005d4c44:
            curl_slist_free_all(list);
            local_428 = pcVar8;
          }
          if (local_450 == CURLE_OK) {
            local_228 = local_418[0];
            local_220 = 0;
            if (puVar13 == (uchar *)0x0) {
              sVar10 = 0;
            }
            else {
              sVar10 = (data->set).postfieldsize;
              if ((long)sVar10 < 0) {
                sVar10 = strlen((char *)puVar13);
              }
            }
            pbVar18 = local_1d8;
            CVar4 = Curl_sha256it(pbVar18,puVar13,sVar10);
            if (CVar4 == CURLE_OK) {
              sVar10 = 0x41;
              pcVar8 = local_138;
              do {
                curl_msnprintf(pcVar8,sVar10,"%02x",(ulong)*pbVar18);
                sVar10 = sVar10 - 2;
                pbVar18 = pbVar18 + 1;
                pcVar8 = pcVar8 + 2;
              } while (sVar10 != 1);
              Curl_http_method(data,conn,&local_258,&local_3fc);
              pcVar8 = (data->state).up.path;
              pcVar5 = (data->state).up.query;
              if (pcVar5 == (char *)0x0) {
                pcVar5 = "";
              }
              pcVar11 = Curl_dyn_ptr(&local_250);
              pcVar12 = Curl_dyn_ptr(&local_2c8);
              pcVar19 = local_138;
              puVar13 = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%s",local_258,pcVar8,pcVar5,
                                               pcVar11,pcVar12,pcVar19);
              if (puVar13 != (uchar *)0x0) {
                sVar6 = strlen((char *)&local_318);
                Curl_strntolower((char *)&local_318,(char *)&local_318,sVar6);
                data_00 = (uchar *)curl_maprintf("%s4_request",&local_318);
                if (data_00 != (uchar *)0x0) {
                  pcVar8 = curl_maprintf("%s/%s/%s/%s",&local_228,&local_368,&local_3b8,data_00);
                  if (pcVar8 == (char *)0x0) {
                    pcVar8 = (char *)0x0;
                  }
                  else {
                    sVar6 = strlen((char *)puVar13);
                    pbVar18 = local_1d8;
                    CVar4 = Curl_sha256it(pbVar18,puVar13,sVar6);
                    if (CVar4 == CURLE_OK) {
                      sVar10 = 0x41;
                      do {
                        curl_msnprintf(pcVar19,sVar10,"%02x",(ulong)*pbVar18);
                        sVar10 = sVar10 - 2;
                        pbVar18 = pbVar18 + 1;
                        pcVar19 = pcVar19 + 2;
                      } while (sVar10 != 1);
                      sVar6 = strlen((char *)&local_318);
                      Curl_strntoupper((char *)&local_318,(char *)&local_318,sVar6);
                      pcVar5 = local_138;
                      data_01 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",&local_318,
                                                       local_418,pcVar8,pcVar5);
                      if (data_01 != (uchar *)0x0) {
                        pcVar19 = (data->state).aptr.passwd;
                        pcVar11 = "";
                        if (pcVar19 != (char *)0x0) {
                          pcVar11 = pcVar19;
                        }
                        key = (uchar *)curl_maprintf("%s4%s",&local_318,pcVar11);
                        if (key == (uchar *)0x0) {
                          local_450 = CURLE_OUT_OF_MEMORY;
                          key = (uchar *)0x0;
                        }
                        else {
                          sVar6 = strlen((char *)key);
                          sVar14 = strlen((char *)&local_228);
                          local_450 = Curl_hmacit(Curl_HMAC_SHA256,key,sVar6 & 0xffffffff,
                                                  (uchar *)&local_228,sVar14 & 0xffffffff,
                                                  (uchar *)&local_3f8);
                          if (local_450 == CURLE_OK) {
                            sVar6 = strlen((char *)&local_368);
                            local_450 = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&local_3f8,0x20,
                                                    (uchar *)&local_368,sVar6 & 0xffffffff,
                                                    (uchar *)&local_3d8);
                            if (local_450 == CURLE_OK) {
                              sVar6 = strlen((char *)&local_3b8);
                              local_450 = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&local_3d8,0x20,
                                                      (uchar *)&local_3b8,sVar6 & 0xffffffff,
                                                      (uchar *)&local_3f8);
                              if (local_450 == CURLE_OK) {
                                sVar6 = strlen((char *)data_00);
                                local_450 = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&local_3f8,0x20,
                                                        data_00,sVar6 & 0xffffffff,
                                                        (uchar *)&local_3d8);
                                if (local_450 == CURLE_OK) {
                                  sVar6 = strlen((char *)data_01);
                                  pbVar18 = (byte *)&local_3f8;
                                  local_450 = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&local_3d8,0x20,
                                                          data_01,sVar6 & 0xffffffff,pbVar18);
                                  if (local_450 == CURLE_OK) {
                                    sVar10 = 0x41;
                                    do {
                                      curl_msnprintf(pcVar5,sVar10,"%02x",(ulong)*pbVar18);
                                      sVar10 = sVar10 - 2;
                                      pbVar18 = pbVar18 + 1;
                                      pcVar5 = pcVar5 + 2;
                                    } while (sVar10 != 1);
                                    pcVar5 = Curl_dyn_ptr(&local_2c8);
                                    local_450 = CURLE_OK;
                                    pcVar16 = curl_maprintf(
                                                  "Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s\r\n"
                                                  ,&local_318,pcVar16,pcVar8,pcVar5,local_138,
                                                  local_428);
                                    if (pcVar16 != (char *)0x0) {
                                      (*Curl_cfree)((data->state).aptr.userpwd);
                                      (data->state).aptr.userpwd = pcVar16;
                                      puVar1 = &(data->state).authhost.field_0x18;
                                      *puVar1 = *puVar1 | 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        goto LAB_005d47ea;
                      }
                    }
                  }
                  local_450 = CURLE_OUT_OF_MEMORY;
                  data_01 = (uchar *)0x0;
                  key = (uchar *)0x0;
                  goto LAB_005d47ea;
                }
              }
              local_450 = CURLE_OUT_OF_MEMORY;
              data_01 = (uchar *)0x0;
              pcVar8 = (char *)0x0;
              data_00 = (uchar *)0x0;
              key = (uchar *)0x0;
              goto LAB_005d47ea;
            }
            local_450 = CURLE_OUT_OF_MEMORY;
          }
          goto LAB_005d47dc;
        }
        local_450 = CURLE_OUT_OF_MEMORY;
      }
    }
    local_428 = (char *)0x0;
  }
LAB_005d47dc:
  puVar13 = (uchar *)0x0;
  data_00 = (uchar *)0x0;
  pcVar8 = (char *)0x0;
  data_01 = (uchar *)0x0;
  key = (uchar *)0x0;
LAB_005d47ea:
  Curl_dyn_free(&local_250);
  Curl_dyn_free(&local_2c8);
  (*Curl_cfree)(puVar13);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(pcVar8);
  (*Curl_cfree)(data_01);
  (*Curl_cfree)(key);
  (*Curl_cfree)(local_428);
  return local_450;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode ret = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  char *date_header = NULL;
  const char *post_data = data->set.postfields;
  size_t post_data_len = 0;
  unsigned char sha_hash[32];
  char sha_hex[65];
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[32] = {0};
  unsigned char sign1[32] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init thoses buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
   */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first provider can't be empty");
    ret = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "service missing in parameters and hostname");
      ret = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "service too long in hostname");
      ret = CURLE_URL_MALFORMAT;
      goto fail;
    }
    strncpy(service, hostname, len);
    service[len] = '\0';

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "region missing in parameters and hostname");
        ret = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "region too long in hostname");
        ret = CURLE_URL_MALFORMAT;
        goto fail;
      }
      strncpy(region, reg, len);
      region[len] = '\0';
    }
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      time(&clock);
  }
#else
  time(&clock);
#endif
  ret = Curl_gmtime(clock, &tm);
  if(ret) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    ret = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  ret = make_headers(data, hostname, timestamp, provider1,
                     &date_header, &canonical_headers, &signed_headers);
  if(ret)
    goto fail;
  ret = CURLE_OUT_OF_MEMORY;

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  if(post_data) {
    if(data->set.postfieldsize < 0)
      post_data_len = strlen(post_data);
    else
      post_data_len = (size_t)data->set.postfieldsize;
  }
  if(Curl_sha256it(sha_hash, (const unsigned char *) post_data,
                   post_data_len))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash, sizeof(sha_hex));

  {
    Curl_HttpReq httpreq;
    const char *method;

    Curl_http_method(data, conn, &method, &httpreq);

    canonical_request =
      curl_maprintf("%s\n" /* HTTPRequestMethod */
                    "%s\n" /* CanonicalURI */
                    "%s\n" /* CanonicalQueryString */
                    "%s\n" /* CanonicalHeaders */
                    "%s\n" /* SignedHeaders */
                    "%s",  /* HashedRequestPayload in hex */
                    method,
                    data->state.up.path,
                    data->state.up.query ? data->state.up.query : "",
                    Curl_dyn_ptr(&canonical_headers),
                    Curl_dyn_ptr(&signed_headers),
                    sha_hex);
    if(!canonical_request)
      goto fail;
  }

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = curl_maprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = curl_maprintf("%s/%s/%s/%s",
                                   date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash, sizeof(sha_hex));

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we ony support HMAC.
   */
  str_to_sign = curl_maprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                              "%s\n" /* RequestDateTime */
                              "%s\n" /* CredentialScope */
                              "%s",  /* HashedCanonicalRequest in hex */
                              provider0,
                              timestamp,
                              credential_scope,
                              sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = curl_maprintf("%s4%s", provider0,
                         data->state.aptr.passwd ?
                         data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0, sizeof(sha_hex));

  /* provider 0 uppercase */
  auth_headers = curl_maprintf("Authorization: %s4-HMAC-SHA256 "
                               "Credential=%s/%s, "
                               "SignedHeaders=%s, "
                               "Signature=%s\r\n"
                               "%s\r\n",
                               provider0,
                               user,
                               credential_scope,
                               Curl_dyn_ptr(&signed_headers),
                               sha_hex,
                               date_header);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  ret = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return ret;
}